

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryIndexedTree.hpp
# Opt level: O1

void __thiscall
primesum::BinaryIndexedTree::init<primesum::BitSieve>
          (BinaryIndexedTree *this,BitSieve *sieve,int64_t low)

{
  ulong uVar1;
  pointer puVar2;
  pointer p_Var3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar4 = sieve->size_ >> 1;
  this->size_ = uVar4;
  std::vector<__int128,_std::allocator<__int128>_>::resize(&this->tree_,uVar4);
  uVar4 = this->size_;
  if (0 < (long)uVar4) {
    puVar2 = (sieve->sieve_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    p_Var3 = (this->tree_).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      uVar6 = (&BitSieve::set_bit_)[(int)uVar5 * 2 & 0x7e] & puVar2[uVar5 >> 6];
      if (uVar6 != 0) {
        uVar6 = low + uVar5 * 2;
      }
      *(ulong *)(p_Var3 + uVar5) = uVar6;
      *(long *)((long)p_Var3 + uVar5 * 0x10 + 8) = (long)uVar6 >> 0x3f;
      uVar6 = uVar5 + 1;
      if (1 < (~uVar5 & uVar6)) {
        puVar7 = (ulong *)(p_Var3 + uVar5);
        uVar8 = *puVar7;
        uVar9 = puVar7[1];
        uVar10 = ~uVar5 & uVar6;
        do {
          uVar1 = uVar5 - 1;
          bVar11 = CARRY8(uVar8,*(ulong *)(p_Var3 + uVar1));
          uVar8 = uVar8 + *(ulong *)(p_Var3 + uVar1);
          uVar9 = uVar9 + *(long *)((long)p_Var3 + uVar1 * 0x10 + 8) + (ulong)bVar11;
          *puVar7 = uVar8;
          puVar7[1] = uVar9;
          uVar5 = uVar5 & uVar1;
          bVar11 = 3 < uVar10;
          uVar10 = uVar10 >> 1;
        } while (bVar11);
      }
      uVar5 = uVar6;
    } while (uVar6 != uVar4);
  }
  return;
}

Assistant:

void init(const T& sieve, int64_t low)
  {
    size_ = sieve.size() / 2;
    tree_.resize(size_);

    for (int64_t i = 0; i < size_; i++)
    {
      int64_t i2 = i * 2;
      tree_[i] = (low + i2) * sieve[i2];
      int64_t k = (i + 1) & ~i;
      for (int64_t j = i; k >>= 1; j &= j - 1)
        tree_[i] += tree_[j - 1];
    }
  }